

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O0

CompoundString *
Js::CompoundString::New
          (CharCount stringLength,CharCount directCharLength,void *buffer,CharCount usedCharLength,
          bool reserveMoreSpace,JavascriptLibrary *library)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  CompoundString *this;
  TrackAllocData local_50;
  JavascriptLibrary *local_28;
  JavascriptLibrary *library_local;
  bool reserveMoreSpace_local;
  void *pvStack_18;
  CharCount usedCharLength_local;
  void *buffer_local;
  CharCount directCharLength_local;
  CharCount stringLength_local;
  
  local_28 = library;
  library_local._3_1_ = reserveMoreSpace;
  library_local._4_4_ = usedCharLength;
  pvStack_18 = buffer;
  buffer_local._0_4_ = directCharLength;
  buffer_local._4_4_ = stringLength;
  if (library == (JavascriptLibrary *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x235,"(library)","library");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pRVar4 = JavascriptLibrary::GetRecycler(local_28);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
             ,0x240);
  pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_50);
  this = (CompoundString *)new<Memory::Recycler>(0x40,pRVar4,0x43c4b0);
  CompoundString(this,buffer_local._4_4_,(CharCount)buffer_local,pvStack_18,library_local._4_4_,
                 (bool)(library_local._3_1_ & 1),local_28);
  return this;
}

Assistant:

CompoundString *CompoundString::New(
        const CharCount stringLength,
        const CharCount directCharLength,
        const void *const buffer,
        const CharCount usedCharLength,
        const bool reserveMoreSpace,
        JavascriptLibrary *const library)
    {
        Assert(library);

        return
            RecyclerNew(
                library->GetRecycler(),
                CompoundString,
                stringLength,
                directCharLength,
                buffer,
                usedCharLength,
                reserveMoreSpace,
                library);
    }